

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O1

void __thiscall wasm::Vacuum::~Vacuum(Vacuum *this)

{
  pointer ppEVar1;
  pointer pTVar2;
  
  ppEVar1 = (this->
            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
            ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
            expressionStack.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)*(pointer *)
                                   ((long)&(this->
                                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                           ).
                                           super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                           .expressionStack.flexible.
                                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x10) - (long)ppEVar1)
    ;
  }
  pTVar2 = (this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
           ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
           super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
           super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                          .
                                          super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                          .
                                          super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::Task>_>
                                  + 0x10) - (long)pTVar2);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override { return std::make_unique<Vacuum>(); }